

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O3

nh_roles_info * nh_get_roles(void)

{
  char *pcVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  boolean bVar5;
  nh_roles_info *pnVar6;
  char **ppcVar7;
  char **ppcVar8;
  nh_bool *__s;
  short *psVar9;
  int iVar10;
  ulong uVar11;
  char **ppcVar12;
  Race *pRVar13;
  Gender *pGVar14;
  ulong uVar15;
  ushort uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  short *psVar20;
  ulong uVar21;
  bool bVar22;
  int local_34;
  
  pnVar6 = (nh_roles_info *)xmalloc(0x50);
  pnVar6->num_roles = 0xe;
  pnVar6->num_races = 6;
  pnVar6->num_genders = 2;
  pnVar6->num_aligns = 3;
  ppcVar7 = (char **)xmalloc(0x70);
  ppcVar8 = (char **)xmalloc(pnVar6->num_roles << 3);
  iVar10 = pnVar6->num_roles;
  if (0 < (long)iVar10) {
    ppcVar12 = &roles[0].name.f;
    lVar17 = 0;
    do {
      pcVar1 = *ppcVar12;
      ppcVar7[lVar17] = ((RoleName *)(ppcVar12 + -1))->m;
      ppcVar8[lVar17] = pcVar1;
      lVar17 = lVar17 + 1;
      ppcVar12 = ppcVar12 + 0x23;
    } while (iVar10 != lVar17);
  }
  pnVar6->rolenames_m = ppcVar7;
  pnVar6->rolenames_f = ppcVar8;
  ppcVar7 = (char **)xmalloc(pnVar6->num_races << 3);
  iVar10 = pnVar6->num_races;
  if (0 < (long)iVar10) {
    pRVar13 = races;
    lVar17 = 0;
    do {
      ppcVar7[lVar17] = pRVar13->noun;
      lVar17 = lVar17 + 1;
      pRVar13 = pRVar13 + 1;
    } while (iVar10 != lVar17);
  }
  pnVar6->racenames = ppcVar7;
  ppcVar7 = (char **)xmalloc(pnVar6->num_genders << 3);
  iVar10 = pnVar6->num_genders;
  if (0 < (long)iVar10) {
    pGVar14 = genders;
    lVar17 = 0;
    do {
      ppcVar7[lVar17] = pGVar14->adj;
      lVar17 = lVar17 + 1;
      pGVar14 = pGVar14 + 1;
    } while (iVar10 != lVar17);
  }
  pnVar6->gendnames = ppcVar7;
  ppcVar7 = (char **)xmalloc(pnVar6->num_aligns << 3);
  iVar10 = pnVar6->num_aligns;
  if (0 < (long)iVar10) {
    lVar17 = 0;
    do {
      *(undefined8 *)((long)ppcVar7 + lVar17) = *(undefined8 *)((long)&aligns[0].adj + lVar17 * 4);
      lVar17 = lVar17 + 8;
    } while ((long)iVar10 * 8 - lVar17 != 0);
  }
  pnVar6->alignnames = ppcVar7;
  uVar3 = flags._148_8_;
  iVar2 = flags.init_race;
  pnVar6->def_role = flags.init_role;
  uVar4 = flags._148_8_;
  pnVar6->def_race = iVar2;
  flags.init_gend = (int)uVar3;
  flags.init_align = SUB84(uVar3,4);
  iVar2 = flags.init_align;
  pnVar6->def_gend = flags.init_gend;
  flags._148_8_ = uVar4;
  pnVar6->def_align = iVar2;
  iVar10 = iVar10 * pnVar6->num_roles * pnVar6->num_races * pnVar6->num_genders;
  __s = (nh_bool *)xmalloc(iVar10);
  memset(__s,0,(long)iVar10);
  iVar10 = pnVar6->num_roles;
  if (0 < iVar10) {
    local_34 = pnVar6->num_races;
    uVar21 = 0;
    do {
      if (0 < local_34) {
        psVar20 = &roles[uVar21].allow;
        uVar19 = 0;
        do {
          bVar5 = ok_race((int)uVar21,(int)uVar19,-1,-1);
          if (bVar5 != '\0') {
            iVar10 = pnVar6->num_genders;
            if (0 < iVar10) {
              psVar9 = &races[uVar19].allow;
              uVar11 = 0;
              do {
                if (uVar11 < 2) {
                  uVar16 = genders[uVar11].allow;
                  if (uVar21 < 0xe) {
                    uVar16 = uVar16 & *psVar20;
                  }
                  if (uVar19 < 6) {
                    uVar16 = uVar16 & *psVar9;
                  }
                  if ((0xfff < uVar16) &&
                     (uVar18 = (ulong)(uint)pnVar6->num_aligns, 0 < pnVar6->num_aligns)) {
                    uVar15 = 0;
                    do {
                      if (uVar15 < 3) {
                        uVar16 = aligns[uVar15].allow;
                        if (uVar21 < 0xe) {
                          uVar16 = uVar16 & *psVar20;
                        }
                        if (uVar19 < 6) {
                          uVar16 = uVar16 & *psVar9;
                        }
                        bVar22 = (uVar16 & 7) != 0;
                      }
                      else {
                        lVar17 = 0x38;
                        do {
                          uVar16 = *(ushort *)(races[0].attrmin + lVar17 + -0x40);
                          if (uVar21 < 0xe) {
                            uVar16 = uVar16 & *psVar20;
                          }
                          if (uVar19 < 6) {
                            uVar16 = uVar16 & *psVar9;
                          }
                          if ((uVar16 & 7) != 0) {
                            bVar22 = true;
                            goto LAB_0023654a;
                          }
                          lVar17 = lVar17 + 0x58;
                        } while (lVar17 != 0x140);
                        bVar22 = false;
                      }
LAB_0023654a:
                      __s[(int)uVar15 +
                          ((pnVar6->num_races * (int)uVar21 + (int)uVar19) * pnVar6->num_genders +
                          (int)uVar11) * (int)uVar18] = bVar22;
                      uVar15 = uVar15 + 1;
                      uVar18 = (ulong)pnVar6->num_aligns;
                    } while ((long)uVar15 < (long)uVar18);
                    iVar10 = pnVar6->num_genders;
                  }
                }
                uVar11 = uVar11 + 1;
              } while ((long)uVar11 < (long)iVar10);
              local_34 = pnVar6->num_races;
            }
          }
          uVar19 = uVar19 + 1;
        } while ((long)uVar19 < (long)local_34);
        iVar10 = pnVar6->num_roles;
      }
      uVar21 = uVar21 + 1;
    } while ((long)uVar21 < (long)iVar10);
  }
  pnVar6->matrix = __s;
  return pnVar6;
}

Assistant:

struct nh_roles_info *nh_get_roles(void)
{
	int i, rolenum, racenum, gendnum, alignnum, arrsize;
	struct nh_roles_info *info = xmalloc(sizeof(struct nh_roles_info));
	const char **names, **names2;
	nh_bool *tmpmatrix;
	
	/* number of choices */
	for (i = 0; roles[i].name.m; i++);
	info->num_roles = i;
	
	for (i = 0; races[i].noun; i++);
	info->num_races = i;
	
	info->num_genders = ROLE_GENDERS;
	info->num_aligns = ROLE_ALIGNS;
	
	/* names of choices */
	names = xmalloc(info->num_roles * sizeof(char*));
	names2 = xmalloc(info->num_roles * sizeof(char*));
	for (i = 0; i < info->num_roles; i++) {
	    names[i]  = roles[i].name.m;
	    names2[i] = roles[i].name.f;
	}
	info->rolenames_m = names;
	info->rolenames_f = names2;

	names = xmalloc(info->num_races * sizeof(char*));
	for (i = 0; i < info->num_races; i++)
	    names[i] = races[i].noun;
	info->racenames = names;
	
	names = xmalloc(info->num_genders * sizeof(char*));
	for (i = 0; i < info->num_genders; i++)
	    names[i] = genders[i].adj;
	info->gendnames = names;
	
	names = xmalloc(info->num_aligns * sizeof(char*));
	for (i = 0; i < info->num_aligns; i++)
	    names[i] = aligns[i].adj;
	info->alignnames = names;
	
	/* default choices */
	info->def_role = flags.init_role;
	info->def_race = flags.init_race;
	info->def_gend = flags.init_gend;
	info->def_align = flags.init_align;
	
	/* valid combinations of choices */
	arrsize = info->num_roles * info->num_races * info->num_genders * info->num_aligns;
	tmpmatrix = xmalloc(arrsize * sizeof(nh_bool));
	memset(tmpmatrix, FALSE, arrsize * sizeof(nh_bool));
	for (rolenum = 0; rolenum < info->num_roles; rolenum++) {
	    for (racenum = 0; racenum < info->num_races; racenum++) {
		if (!ok_race(rolenum, racenum, ROLE_NONE, ROLE_NONE))
		    continue;
		for (gendnum = 0; gendnum < info->num_genders; gendnum++) {
		    if (!ok_gend(rolenum, racenum, gendnum, ROLE_NONE))
			continue;
		    for (alignnum = 0; alignnum < info->num_aligns; alignnum++) {
			tmpmatrix[nh_cm_idx((*info), rolenum, racenum, gendnum, alignnum)] =
			    ok_align(rolenum, racenum, gendnum, alignnum);
		    }
		}
	    }
	}
	info->matrix = tmpmatrix;
	
	return info;
}